

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::SendAndClose(TCPSocket *this,string *str)

{
  string *local_18;
  string *str_local;
  TCPSocket *this_local;
  
  local_18 = str;
  str_local = (string *)this;
  Buffer::New((Buffer *)&stack0xffffffffffffffd8,str);
  SendAndClose(this,(Ptr *)&stack0xffffffffffffffd8,0);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)&stack0xffffffffffffffd8)
  ;
  return;
}

Assistant:

void TCPSocket::SendAndClose(const std::string &str) {
	this->SendAndClose(Buffer::New(str),0);
}